

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

MainFunc __thiscall capnp::compiler::CompilerMain::getGenIdMain(CompilerMain *this)

{
  ProcessContext *context;
  StringPtr extendedDescription;
  StringPtr briefDescription;
  StringPtr version;
  Iface *extraout_RDX;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:122:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:122:27)>
  *in_RSI;
  MainFunc MVar1;
  undefined1 local_7a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:122:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:122:27)>
  local_78;
  Function<kj::MainBuilder::Validity_()> local_68;
  StringPtr local_58;
  StringPtr local_48;
  StringPtr local_38;
  MainBuilder local_28;
  CompilerMain *this_local;
  
  context = *(ProcessContext **)&in_RSI->field_0x8;
  this_local = this;
  kj::StringPtr::StringPtr(&local_38,"Cap\'n Proto version (unknown)");
  kj::StringPtr::StringPtr
            (&local_48,"Generates a new 64-bit unique ID for use in a Cap\'n Proto schema.");
  kj::StringPtr::StringPtr(&local_58,(void *)0x0);
  version.content.size_ = local_38.content.size_;
  version.content.ptr = local_38.content.ptr;
  briefDescription.content.size_ = local_48.content.size_;
  briefDescription.content.ptr = local_48.content.ptr;
  extendedDescription.content.size_ = local_58.content.size_;
  extendedDescription.content.ptr = local_58.content.ptr;
  kj::MainBuilder::MainBuilder(&local_28,context,version,briefDescription,extendedDescription);
  local_78.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getGenIdMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getGenIdMain()::_lambda(auto:1&,(auto:2&&)___)_2_>
                         (in_RSI,(_ *)(local_7a + 1),(CompilerMain *)local_7a,
                          (Type *)local_38.content.size_,(Type *)local_48.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getGenIdMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getGenIdMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_68,&local_78);
  kj::MainBuilder::callAfterParsing(&local_28,&local_68);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_68);
  kj::MainBuilder::~MainBuilder(&local_28);
  MVar1.impl.ptr = extraout_RDX;
  MVar1.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar1.impl;
}

Assistant:

kj::MainFunc getGenIdMain() {
    return kj::MainBuilder(context, VERSION_STRING,
          "Generates a new 64-bit unique ID for use in a Cap'n Proto schema.")
        .callAfterParsing(KJ_BIND_METHOD(*this, generateId))
        .build();
  }